

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KmerCounter.cc
# Opt level: O0

void __thiscall KmerCounter::KmerCounter(KmerCounter *this,WorkSpace *_ws,ifstream *infile)

{
  size_t in_RCX;
  int in_EDX;
  void *__buf;
  WorkSpace *in_RSI;
  KmerCounter *in_RDI;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3d8f32);
  std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::vector
            ((vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)0x3d8f45);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x3d8f58);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
            *)0x3d8f6b);
  std::__cxx11::string::string((string *)&in_RDI->name);
  in_RDI->ws = in_RSI;
  in_RDI->kci_peak_f = -1.0;
  std::
  unordered_map<long,_float,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_float>_>_>
  ::unordered_map((unordered_map<long,_float,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_float>_>_>
                   *)0x3d8faa);
  std::
  unordered_map<unsigned___int128,_float,_std::hash<unsigned___int128>,_std::equal_to<unsigned___int128>,_std::allocator<std::pair<const_unsigned___int128,_float>_>_>
  ::unordered_map((unordered_map<unsigned___int128,_float,_std::hash<unsigned___int128>,_std::equal_to<unsigned___int128>,_std::allocator<std::pair<const_unsigned___int128,_float>_>_>
                   *)0x3d8fc0);
  read(in_RDI,in_EDX,__buf,in_RCX);
  return;
}

Assistant:

KmerCounter::KmerCounter(const WorkSpace &_ws, std::ifstream &infile): ws(_ws) {
    read(infile);
}